

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Trigger * fkActionTrigger(Parse *pParse,Table *pTab,FKey *pFKey,ExprList *pChanges)

{
  short sVar1;
  Table *pTVar2;
  Table *pParse_00;
  u8 uVar3;
  int iVar4;
  Expr *pEVar5;
  Expr *pEVar6;
  Expr *pRight;
  ExprList *pEList;
  SrcList *pSrc;
  Schema *pSVar7;
  Select *pSVar8;
  int local_12c;
  int local_11c;
  Expr *pRaise;
  Token tFrom;
  Expr *pDflt;
  Expr *pNew;
  Expr *pEq;
  undefined1 local_e0 [4];
  int iFromCol;
  Token tToCol;
  Token tFromCol;
  Token tNew;
  Token tOld;
  Expr *pWhen;
  Select *pSStack_90;
  int i;
  Select *pSelect;
  ExprList *pList;
  Expr *pWhere;
  TriggerStep *pStep;
  int *aiCol;
  Index *pIdx;
  Expr *pEStack_58;
  int nFrom;
  char *zFrom;
  Expr *pEStack_48;
  int iAction;
  Trigger *pTrigger;
  sqlite3 *psStack_38;
  int action;
  sqlite3 *db;
  ExprList *pChanges_local;
  FKey *pFKey_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  psStack_38 = pParse->db;
  zFrom._4_4_ = (uint)(pChanges != (ExprList *)0x0);
  pTrigger._4_4_ = (uint)pFKey->aAction[(int)zFrom._4_4_];
  if ((pTrigger._4_4_ == 7) && ((psStack_38->flags & 0x80000) != 0)) {
    return (Trigger *)0x0;
  }
  pEStack_48 = (Expr *)pFKey->apTrigger[(int)zFrom._4_4_];
  if ((pTrigger._4_4_ != 0) && (pEStack_48 == (Expr *)0x0)) {
    aiCol = (int *)0x0;
    pStep = (TriggerStep *)0x0;
    pWhere = (Expr *)0x0;
    pList = (ExprList *)0x0;
    pSelect = (Select *)0x0;
    pSStack_90 = (Select *)0x0;
    tOld.n = 0;
    tOld._12_4_ = 0;
    db = (sqlite3 *)pChanges;
    pChanges_local = (ExprList *)pFKey;
    pFKey_local = (FKey *)pTab;
    pTab_local = (Table *)pParse;
    iVar4 = sqlite3FkLocateIndex(pParse,pTab,pFKey,(Index **)&aiCol,(int **)&pStep);
    if (iVar4 != 0) {
      return (Trigger *)0x0;
    }
    for (pWhen._4_4_ = 0; pWhen._4_4_ < pChanges_local[1].nExpr; pWhen._4_4_ = pWhen._4_4_ + 1) {
      tNew._8_8_ = anon_var_dwarf_107d5;
      tFromCol._8_8_ = anon_var_dwarf_107c7;
      tNew.z = &DAT_00000003;
      if (pStep == (TriggerStep *)0x0) {
        local_11c = *(int *)&pChanges_local[1].a[0].zSpan;
      }
      else {
        local_11c = *(int *)(&pStep->op + (long)pWhen._4_4_ * 4);
      }
      if (aiCol == (int *)0x0) {
        sVar1 = *(short *)&pFKey_local->aCol[0].field_0x4;
      }
      else {
        sVar1 = *(short *)(*(long *)(aiCol + 2) + (long)pWhen._4_4_ * 2);
      }
      local_12c = (int)sVar1;
      sqlite3TokenInit((Token *)local_e0,
                       *(char **)(pFKey_local->pNextFrom->aAction + (long)local_12c * 0x20 + -0x2d))
      ;
      sqlite3TokenInit((Token *)&tToCol.n,
                       *(char **)(*(long *)(*(long *)pChanges_local + 8) + (long)local_11c * 0x20));
      pTVar2 = pTab_local;
      pEVar5 = sqlite3ExprAlloc(psStack_38,0x3b,(Token *)&tNew.n,0);
      pEVar6 = sqlite3ExprAlloc(psStack_38,0x3b,(Token *)local_e0,0);
      pEVar5 = sqlite3PExpr((Parse *)pTVar2,0x82,pEVar5,pEVar6);
      pEVar6 = sqlite3ExprAlloc(psStack_38,0x3b,(Token *)&tToCol.n,0);
      pEVar5 = sqlite3PExpr((Parse *)pTVar2,0x35,pEVar5,pEVar6);
      pList = (ExprList *)sqlite3ExprAnd(psStack_38,(Expr *)pList,pEVar5);
      pTVar2 = pTab_local;
      if (db != (sqlite3 *)0x0) {
        pEVar5 = sqlite3ExprAlloc(psStack_38,0x3b,(Token *)&tNew.n,0);
        pEVar6 = sqlite3ExprAlloc(psStack_38,0x3b,(Token *)local_e0,0);
        pEVar5 = sqlite3PExpr((Parse *)pTVar2,0x82,pEVar5,pEVar6);
        pParse_00 = pTab_local;
        pEVar6 = sqlite3ExprAlloc(psStack_38,0x3b,(Token *)&tFromCol.n,0);
        pRight = sqlite3ExprAlloc(psStack_38,0x3b,(Token *)local_e0,0);
        pEVar6 = sqlite3PExpr((Parse *)pParse_00,0x82,pEVar6,pRight);
        pEVar5 = sqlite3PExpr((Parse *)pTVar2,0x2d,pEVar5,pEVar6);
        tOld._8_8_ = sqlite3ExprAnd(psStack_38,(Expr *)tOld._8_8_,pEVar5);
      }
      pTVar2 = pTab_local;
      if ((pTrigger._4_4_ != 7) && ((pTrigger._4_4_ != 10 || (db != (sqlite3 *)0x0)))) {
        if (pTrigger._4_4_ == 10) {
          pEVar5 = sqlite3ExprAlloc(psStack_38,0x3b,(Token *)&tFromCol.n,0);
          pEVar6 = sqlite3ExprAlloc(psStack_38,0x3b,(Token *)local_e0,0);
          pDflt = sqlite3PExpr((Parse *)pTVar2,0x82,pEVar5,pEVar6);
        }
        else if (pTrigger._4_4_ == 9) {
          tFrom._8_8_ = *(undefined8 *)
                         (*(long *)(*(long *)pChanges_local + 8) + (long)local_11c * 0x20 + 8);
          if ((Expr *)tFrom._8_8_ == (Expr *)0x0) {
            pDflt = sqlite3ExprAlloc(psStack_38,0x6e,(Token *)0x0,0);
          }
          else {
            pDflt = sqlite3ExprDup(psStack_38,(Expr *)tFrom._8_8_,0);
          }
        }
        else {
          pDflt = sqlite3ExprAlloc(psStack_38,0x6e,(Token *)0x0,0);
        }
        pSelect = (Select *)sqlite3ExprListAppend((Parse *)pTab_local,(ExprList *)pSelect,pDflt);
        sqlite3ExprListSetName((Parse *)pTab_local,(ExprList *)pSelect,(Token *)&tToCol.n,0);
      }
    }
    sqlite3DbFree(psStack_38,pStep);
    pEStack_58 = (Expr *)**(undefined8 **)pChanges_local;
    pIdx._4_4_ = sqlite3Strlen30((char *)pEStack_58);
    if (pTrigger._4_4_ == 7) {
      pRaise = pEStack_58;
      tFrom.z._0_4_ = pIdx._4_4_;
      pEVar5 = sqlite3Expr(psStack_38,0x47,"FOREIGN KEY constraint failed");
      pTVar2 = pTab_local;
      if (pEVar5 != (Expr *)0x0) {
        pEVar5->affinity = '\x02';
      }
      pEList = sqlite3ExprListAppend((Parse *)pTab_local,(ExprList *)0x0,pEVar5);
      pSrc = sqlite3SrcListAppend(psStack_38,(SrcList *)0x0,(Token *)&pRaise,(Token *)0x0);
      pSStack_90 = sqlite3SelectNew((Parse *)pTVar2,pEList,pSrc,(Expr *)pList,(ExprList *)0x0,
                                    (Expr *)0x0,(ExprList *)0x0,0,(Expr *)0x0);
      pList = (ExprList *)0x0;
    }
    (psStack_38->lookaside).bDisable = (psStack_38->lookaside).bDisable + 1;
    pEVar5 = (Expr *)sqlite3DbMallocZero(psStack_38,(long)pIdx._4_4_ + 0xa1);
    pEStack_48 = pEVar5;
    if (pEVar5 != (Expr *)0x0) {
      pWhere = pEVar5 + 1;
      pEVar5->pAggInfo = (AggInfo *)pWhere;
      pEVar5[1].pRight = (Expr *)&pEVar5[2].pLeft;
      memcpy(pEVar5[1].pRight,pEStack_58,(long)pIdx._4_4_);
      pEVar6 = sqlite3ExprDup(psStack_38,(Expr *)pList,1);
      pEVar5[1].x.pList = (ExprList *)pEVar6;
      pSVar7 = (Schema *)sqlite3ExprListDup(psStack_38,(ExprList *)pSelect,1);
      *(Schema **)&pEVar5[1].nHeight = pSVar7;
      pSVar8 = sqlite3SelectDup(psStack_38,pSStack_90,1);
      pEVar5[1].pLeft = (Expr *)pSVar8;
      if (tOld._8_8_ != 0) {
        tOld._8_8_ = sqlite3PExpr((Parse *)pTab_local,0x13,(Expr *)tOld._8_8_,(Expr *)0x0);
        pEVar5 = sqlite3ExprDup(psStack_38,(Expr *)tOld._8_8_,1);
        pEStack_48->pRight = pEVar5;
      }
    }
    (psStack_38->lookaside).bDisable = (psStack_38->lookaside).bDisable - 1;
    sqlite3ExprDelete(psStack_38,(Expr *)pList);
    sqlite3ExprDelete(psStack_38,(Expr *)tOld._8_8_);
    sqlite3ExprListDelete(psStack_38,(ExprList *)pSelect);
    sqlite3SelectDelete(psStack_38,pSStack_90);
    if (psStack_38->mallocFailed == '\x01') {
      fkTriggerDelete(psStack_38,(Trigger *)pEStack_48);
      return (Trigger *)0x0;
    }
    if (pTrigger._4_4_ == 7) {
      pWhere->op = '\x7f';
    }
    else if ((pTrigger._4_4_ == 10) && (db == (sqlite3 *)0x0)) {
      pWhere->op = 'u';
    }
    else {
      pWhere->op = 'v';
    }
    (pWhere->u).zToken = (char *)pEStack_48;
    *(Schema **)&pEStack_48->nHeight = (Schema *)pFKey_local[1].pPrevTo;
    *(Schema **)&pEStack_48->iColumn = (Schema *)pFKey_local[1].pPrevTo;
    (&pChanges_local[1].a[0].pExpr)[(int)zFrom._4_4_] = pEStack_48;
    uVar3 = 'u';
    if (db != (sqlite3 *)0x0) {
      uVar3 = 'v';
    }
    *(u8 *)&pEStack_48->pLeft = uVar3;
  }
  return (Trigger *)pEStack_48;
}

Assistant:

static Trigger *fkActionTrigger(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being updated or deleted from */
  FKey *pFKey,                    /* Foreign key to get action for */
  ExprList *pChanges              /* Change-list for UPDATE, NULL for DELETE */
){
  sqlite3 *db = pParse->db;       /* Database handle */
  int action;                     /* One of OE_None, OE_Cascade etc. */
  Trigger *pTrigger;              /* Trigger definition to return */
  int iAction = (pChanges!=0);    /* 1 for UPDATE, 0 for DELETE */

  action = pFKey->aAction[iAction];
  if( action==OE_Restrict && (db->flags & SQLITE_DeferFKs) ){
    return 0;
  }
  pTrigger = pFKey->apTrigger[iAction];

  if( action!=OE_None && !pTrigger ){
    char const *zFrom;            /* Name of child table */
    int nFrom;                    /* Length in bytes of zFrom */
    Index *pIdx = 0;              /* Parent key index for this FK */
    int *aiCol = 0;               /* child table cols -> parent key cols */
    TriggerStep *pStep = 0;        /* First (only) step of trigger program */
    Expr *pWhere = 0;             /* WHERE clause of trigger step */
    ExprList *pList = 0;          /* Changes list if ON UPDATE CASCADE */
    Select *pSelect = 0;          /* If RESTRICT, "SELECT RAISE(...)" */
    int i;                        /* Iterator variable */
    Expr *pWhen = 0;              /* WHEN clause for the trigger */

    if( sqlite3FkLocateIndex(pParse, pTab, pFKey, &pIdx, &aiCol) ) return 0;
    assert( aiCol || pFKey->nCol==1 );

    for(i=0; i<pFKey->nCol; i++){
      Token tOld = { "old", 3 };  /* Literal "old" token */
      Token tNew = { "new", 3 };  /* Literal "new" token */
      Token tFromCol;             /* Name of column in child table */
      Token tToCol;               /* Name of column in parent table */
      int iFromCol;               /* Idx of column in child table */
      Expr *pEq;                  /* tFromCol = OLD.tToCol */

      iFromCol = aiCol ? aiCol[i] : pFKey->aCol[0].iFrom;
      assert( iFromCol>=0 );
      assert( pIdx!=0 || (pTab->iPKey>=0 && pTab->iPKey<pTab->nCol) );
      assert( pIdx==0 || pIdx->aiColumn[i]>=0 );
      sqlite3TokenInit(&tToCol,
                   pTab->aCol[pIdx ? pIdx->aiColumn[i] : pTab->iPKey].zName);
      sqlite3TokenInit(&tFromCol, pFKey->pFrom->aCol[iFromCol].zName);

      /* Create the expression "OLD.zToCol = zFromCol". It is important
      ** that the "OLD.zToCol" term is on the LHS of the = operator, so
      ** that the affinity and collation sequence associated with the
      ** parent table are used for the comparison. */
      pEq = sqlite3PExpr(pParse, TK_EQ,
          sqlite3PExpr(pParse, TK_DOT, 
            sqlite3ExprAlloc(db, TK_ID, &tOld, 0),
            sqlite3ExprAlloc(db, TK_ID, &tToCol, 0)),
          sqlite3ExprAlloc(db, TK_ID, &tFromCol, 0)
      );
      pWhere = sqlite3ExprAnd(db, pWhere, pEq);

      /* For ON UPDATE, construct the next term of the WHEN clause.
      ** The final WHEN clause will be like this:
      **
      **    WHEN NOT(old.col1 IS new.col1 AND ... AND old.colN IS new.colN)
      */
      if( pChanges ){
        pEq = sqlite3PExpr(pParse, TK_IS,
            sqlite3PExpr(pParse, TK_DOT, 
              sqlite3ExprAlloc(db, TK_ID, &tOld, 0),
              sqlite3ExprAlloc(db, TK_ID, &tToCol, 0)),
            sqlite3PExpr(pParse, TK_DOT, 
              sqlite3ExprAlloc(db, TK_ID, &tNew, 0),
              sqlite3ExprAlloc(db, TK_ID, &tToCol, 0))
            );
        pWhen = sqlite3ExprAnd(db, pWhen, pEq);
      }
  
      if( action!=OE_Restrict && (action!=OE_Cascade || pChanges) ){
        Expr *pNew;
        if( action==OE_Cascade ){
          pNew = sqlite3PExpr(pParse, TK_DOT, 
            sqlite3ExprAlloc(db, TK_ID, &tNew, 0),
            sqlite3ExprAlloc(db, TK_ID, &tToCol, 0));
        }else if( action==OE_SetDflt ){
          Expr *pDflt = pFKey->pFrom->aCol[iFromCol].pDflt;
          if( pDflt ){
            pNew = sqlite3ExprDup(db, pDflt, 0);
          }else{
            pNew = sqlite3ExprAlloc(db, TK_NULL, 0, 0);
          }
        }else{
          pNew = sqlite3ExprAlloc(db, TK_NULL, 0, 0);
        }
        pList = sqlite3ExprListAppend(pParse, pList, pNew);
        sqlite3ExprListSetName(pParse, pList, &tFromCol, 0);
      }
    }
    sqlite3DbFree(db, aiCol);

    zFrom = pFKey->pFrom->zName;
    nFrom = sqlite3Strlen30(zFrom);

    if( action==OE_Restrict ){
      Token tFrom;
      Expr *pRaise; 

      tFrom.z = zFrom;
      tFrom.n = nFrom;
      pRaise = sqlite3Expr(db, TK_RAISE, "FOREIGN KEY constraint failed");
      if( pRaise ){
        pRaise->affinity = OE_Abort;
      }
      pSelect = sqlite3SelectNew(pParse, 
          sqlite3ExprListAppend(pParse, 0, pRaise),
          sqlite3SrcListAppend(db, 0, &tFrom, 0),
          pWhere,
          0, 0, 0, 0, 0
      );
      pWhere = 0;
    }

    /* Disable lookaside memory allocation */
    db->lookaside.bDisable++;

    pTrigger = (Trigger *)sqlite3DbMallocZero(db, 
        sizeof(Trigger) +         /* struct Trigger */
        sizeof(TriggerStep) +     /* Single step in trigger program */
        nFrom + 1                 /* Space for pStep->zTarget */
    );
    if( pTrigger ){
      pStep = pTrigger->step_list = (TriggerStep *)&pTrigger[1];
      pStep->zTarget = (char *)&pStep[1];
      memcpy((char *)pStep->zTarget, zFrom, nFrom);
  
      pStep->pWhere = sqlite3ExprDup(db, pWhere, EXPRDUP_REDUCE);
      pStep->pExprList = sqlite3ExprListDup(db, pList, EXPRDUP_REDUCE);
      pStep->pSelect = sqlite3SelectDup(db, pSelect, EXPRDUP_REDUCE);
      if( pWhen ){
        pWhen = sqlite3PExpr(pParse, TK_NOT, pWhen, 0);
        pTrigger->pWhen = sqlite3ExprDup(db, pWhen, EXPRDUP_REDUCE);
      }
    }

    /* Re-enable the lookaside buffer, if it was disabled earlier. */
    db->lookaside.bDisable--;

    sqlite3ExprDelete(db, pWhere);
    sqlite3ExprDelete(db, pWhen);
    sqlite3ExprListDelete(db, pList);
    sqlite3SelectDelete(db, pSelect);
    if( db->mallocFailed==1 ){
      fkTriggerDelete(db, pTrigger);
      return 0;
    }
    assert( pStep!=0 );

    switch( action ){
      case OE_Restrict:
        pStep->op = TK_SELECT; 
        break;
      case OE_Cascade: 
        if( !pChanges ){ 
          pStep->op = TK_DELETE; 
          break; 
        }
      default:
        pStep->op = TK_UPDATE;
    }
    pStep->pTrig = pTrigger;
    pTrigger->pSchema = pTab->pSchema;
    pTrigger->pTabSchema = pTab->pSchema;
    pFKey->apTrigger[iAction] = pTrigger;
    pTrigger->op = (pChanges ? TK_UPDATE : TK_DELETE);
  }

  return pTrigger;
}